

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O2

sysbvm_tuple_t
sysbvm_astMessageChainNode_primitiveAnalyze
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  ulong uVar1;
  _Bool _Var2;
  sysbvm_tuple_t sVar3;
  sysbvm_tuple_t sVar4;
  sysbvm_tuple_t sVar5;
  size_t i;
  undefined8 uVar6;
  sysbvm_tuple_t local_e8;
  sysbvm_tuple_t local_e0;
  sysbvm_tuple_t local_d8;
  sysbvm_tuple_t local_d0;
  sysbvm_tuple_t local_c8;
  sysbvm_tuple_t local_c0;
  sysbvm_tuple_t local_b8;
  sysbvm_tuple_t local_b0;
  sysbvm_tuple_t local_a8;
  sysbvm_tuple_t local_a0;
  sysbvm_tuple_t local_98;
  sysbvm_tuple_t local_90;
  sysbvm_tuple_t local_88;
  sysbvm_tuple_t local_80;
  sysbvm_tuple_t local_78;
  sysbvm_tuple_t local_70;
  sysbvm_tuple_t local_68;
  sysbvm_stackFrameSourcePositionRecord_t sourcePositionRecord;
  sysbvm_stackFrameRecord_t local_48;
  undefined8 local_38;
  undefined1 *local_30;
  
  if (argumentCount != 2) {
    sysbvm_error_argumentCountMismatch(2,argumentCount);
  }
  sVar5 = 0;
  memset(&local_e8,0,0x88);
  local_48.previous = (sysbvm_stackFrameRecord_s *)0x0;
  local_48.type = SYSBVM_STACK_FRAME_RECORD_TYPE_GC_ROOTS;
  local_48._12_4_ = 0;
  local_38 = 0x11;
  local_30 = (undefined1 *)&local_e8;
  sysbvm_stackFrame_pushRecord(&local_48);
  local_e8 = sysbvm_context_shallowCopy(context,*arguments);
  sVar3 = sysbvm_analysisAndEvaluationEnvironment_ensureValidAnalyzerToken(context,arguments[1]);
  *(sysbvm_tuple_t *)(local_e8 + 0x18) = sVar3;
  sourcePositionRecord.previous = (sysbvm_stackFrameRecord_t *)0x0;
  sourcePositionRecord.type = SYSBVM_STACK_FRAME_RECORD_TYPE_SOURCE_POSITION;
  sourcePositionRecord.sourcePosition = *(sysbvm_tuple_t *)(local_e8 + 0x10);
  sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t *)&sourcePositionRecord);
  uVar1 = *(ulong *)(local_e8 + 0x38);
  if ((uVar1 & 0xf) == 0 && uVar1 != 0) {
    sVar5 = (sysbvm_tuple_t)(*(uint *)(uVar1 + 0xc) >> 3);
  }
  if (*(sysbvm_tuple_t *)(local_e8 + 0x28) != 0) {
    local_e0 = sysbvm_interpreter_analyzeASTWithDirectTypeWithEnvironment
                         (context,*(sysbvm_tuple_t *)(local_e8 + 0x28),arguments[1]);
    *(sysbvm_tuple_t *)(local_e8 + 0x28) = local_e0;
    _Var2 = sysbvm_astNode_isTupleWithLookupStartingFromNode(context,local_e0);
    if (_Var2) {
      uVar1 = *(ulong *)(local_e0 + 0x28);
      *(ulong *)(local_e8 + 0x28) = uVar1;
      local_d8 = *(sysbvm_tuple_t *)(local_e0 + 0x30);
      *(sysbvm_tuple_t *)(local_e8 + 0x30) = local_d8;
      local_e0 = uVar1;
    }
    if (local_e0 == 0 || (local_e0 & 0xf) != 0) {
      local_b8 = 0;
    }
    else {
      local_b8 = *(sysbvm_tuple_t *)(local_e0 + 0x20);
      if ((local_b8 != 0) &&
         (_Var2 = sysbvm_astNode_isLiteralNode(context,*(sysbvm_tuple_t *)(local_e8 + 0x28)), _Var2)
         ) {
        local_b0 = sysbvm_tuple_getType(context,local_b8);
        local_a8 = sysbvm_type_getAnalyzeMessageChainNodeWithEnvironmentFunction(context,local_b0);
        if (local_a8 != 0) {
          sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)&sourcePositionRecord);
          sysbvm_stackFrame_popRecord(&local_48);
          sVar3 = sysbvm_function_apply3(context,local_a8,local_b8,local_e8,arguments[1]);
          return sVar3;
        }
      }
    }
    if ((int)sVar5 == 1) {
      uVar1 = *(ulong *)(local_e8 + 0x38);
      if ((uVar1 & 0xf) == 0 && uVar1 != 0) {
        local_c0 = *(sysbvm_tuple_t *)(uVar1 + 0x10);
      }
      else {
        local_c0 = 0;
      }
      local_80 = sysbvm_astMessageChainMessageNode_expandToMessageWithReceiver
                           (context,local_c0,local_e0,local_d8);
      sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)&sourcePositionRecord);
      sysbvm_stackFrame_popRecord(&local_48);
      sVar3 = sysbvm_interpreter_analyzeASTWithCurrentExpectedTypeWithEnvironment
                        (context,local_e0,arguments[1]);
      return sVar3;
    }
    if (sVar5 == 0) {
      sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)&sourcePositionRecord);
      sysbvm_stackFrame_popRecord(&local_48);
      return local_e0;
    }
    _Var2 = sysbvm_astNode_isLiteralNode(context,local_e0);
    if (_Var2) {
      local_90 = local_e0;
      local_88 = local_e0;
    }
    else {
      if ((local_e0 & 0xf) == 0 && local_e0 != 0) {
        local_a0 = *(sysbvm_tuple_t *)(local_e0 + 0x10);
      }
      else {
        local_a0 = 0;
      }
      sVar3 = sysbvm_symbol_internWithCString(context,"<messageChainReceiver>");
      local_98 = sysbvm_generatedSymbol_create(context,sVar3,local_a0);
      sVar3 = local_a0;
      sVar4 = sysbvm_astLiteralNode_create(context,local_a0,local_98);
      sVar3 = sysbvm_astVariableDefinitionNode_create(context,sVar3,sVar4,0,local_e0,false);
      *(sysbvm_tuple_t *)(sVar3 + 0x20) = local_b8;
      local_90 = sVar3;
      sVar4 = sysbvm_analysisAndEvaluationEnvironment_ensureValidAnalyzerToken(context,arguments[1])
      ;
      *(sysbvm_tuple_t *)(sVar3 + 0x18) = sVar4;
      sVar4 = sysbvm_analysisEnvironment_setNewSymbolLocalBinding
                        (context,arguments[1],local_a0,local_98,local_b8);
      *(sysbvm_tuple_t *)(sVar3 + 0x40) = sVar4;
      local_88 = sysbvm_astIdentifierReferenceNode_create(context,local_a0,local_98);
    }
  }
  local_d0 = sysbvm_array_create(context,sVar5);
  *(undefined8 *)(local_e8 + 0x20) = 0;
  for (sVar3 = 0; sVar5 != sVar3; sVar3 = sVar3 + 1) {
    uVar1 = *(ulong *)(local_e8 + 0x38);
    if ((uVar1 & 0xf) == 0 && uVar1 != 0) {
      local_c0 = *(sysbvm_tuple_t *)(uVar1 + 0x10 + sVar3 * 8);
    }
    else {
      local_c0 = 0;
    }
    local_c8 = sysbvm_astMessageChainMessageNode_expandToMessageWithReceiver
                         (context,local_c0,local_88,local_d8);
    if ((local_d0 & 0xf) == 0 && local_d0 != 0) {
      *(sysbvm_tuple_t *)(local_d0 + 0x10 + sVar3 * 8) = local_c8;
    }
  }
  sVar3 = *(sysbvm_tuple_t *)(local_e8 + 0x10);
  sVar5 = sysbvm_array_create(context,0);
  local_80 = sysbvm_astSequenceNode_create(context,sVar3,sVar5,local_d0);
  local_70 = sysbvm_interpreter_analyzeASTWithCurrentExpectedTypeWithEnvironment
                       (context,local_80,arguments[1]);
  local_68 = local_70;
  if (local_90 != local_88) {
    local_78 = sysbvm_array_create(context,2);
    if ((local_78 & 0xf) == 0 && local_78 != 0) {
      *(sysbvm_tuple_t *)(local_78 + 0x10) = local_90;
    }
    if ((local_78 & 0xf) == 0 && local_78 != 0) {
      *(sysbvm_tuple_t *)(local_78 + 0x18) = local_70;
    }
    sVar3 = *(sysbvm_tuple_t *)(local_e8 + 0x10);
    uVar6 = 0;
    sVar5 = sysbvm_array_create(context,0);
    local_68 = sysbvm_astSequenceNode_create(context,sVar3,sVar5,local_78);
    if ((local_70 & 0xf) == 0 && local_70 != 0) {
      uVar6 = *(undefined8 *)(local_70 + 0x20);
    }
    *(undefined8 *)(local_68 + 0x20) = uVar6;
    sVar3 = sysbvm_analysisAndEvaluationEnvironment_ensureValidAnalyzerToken(context,arguments[1]);
    *(sysbvm_tuple_t *)(local_68 + 0x18) = sVar3;
  }
  sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)&sourcePositionRecord);
  sysbvm_stackFrame_popRecord(&local_48);
  return local_68;
}

Assistant:

static sysbvm_tuple_t sysbvm_astMessageChainNode_primitiveAnalyze(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)context;
    (void)closure;
    if(argumentCount != 2) sysbvm_error_argumentCountMismatch(2, argumentCount);

    sysbvm_tuple_t *node = &arguments[0];
    sysbvm_tuple_t *environment = &arguments[1];

    struct {
        sysbvm_astMessageChainNode_t *chainNode;
        sysbvm_tuple_t analyzedReceiver;
        sysbvm_tuple_t analyzedReceiverTypeExpression;
        sysbvm_tuple_t expandedChainedMessages;
        sysbvm_tuple_t expandedChainedMessageNode;
        sysbvm_tuple_t chainedMessageNode;

        sysbvm_tuple_t receiverType;
        sysbvm_tuple_t receiverMetaType;
        sysbvm_tuple_t analysisFunction;

        sysbvm_tuple_t receiverSourcePosition;
        sysbvm_tuple_t expansionReceiverSymbol;
        sysbvm_tuple_t expansionReceiverExpression;
        sysbvm_tuple_t expansionReceiverIdentifier;
        sysbvm_tuple_t expansionMessageSequence;
        sysbvm_tuple_t expansionLocalAndMessageSequenceArray;

        sysbvm_tuple_t analyzedExpandedChainedMessages;
        sysbvm_tuple_t analyzedExpansion;
    } gcFrame = {0};
    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);
    
    gcFrame.chainNode = (sysbvm_astMessageChainNode_t*)sysbvm_context_shallowCopy(context, *node);
    gcFrame.chainNode->super.analyzerToken = sysbvm_analysisAndEvaluationEnvironment_ensureValidAnalyzerToken(context, *environment);
    SYSBVM_STACKFRAME_PUSH_SOURCE_POSITION(sourcePositionRecord, gcFrame.chainNode->super.sourcePosition);

    size_t chainedMessageCount = sysbvm_array_getSize(gcFrame.chainNode->messages);

    if(gcFrame.chainNode->receiver)
    {
        gcFrame.analyzedReceiver = sysbvm_interpreter_analyzeASTWithDirectTypeWithEnvironment(context, gcFrame.chainNode->receiver, *environment);
        gcFrame.chainNode->receiver = gcFrame.analyzedReceiver;

        // Inline the object with lookup starting from node.
        if(sysbvm_astNode_isTupleWithLookupStartingFromNode(context, gcFrame.analyzedReceiver))
        {
            sysbvm_astTupleWithLookupStartingFromNode_t *objectLookup = (sysbvm_astTupleWithLookupStartingFromNode_t*)gcFrame.analyzedReceiver;
            gcFrame.analyzedReceiver = objectLookup->tupleExpression;
            gcFrame.chainNode->receiver = gcFrame.analyzedReceiver;
            
            gcFrame.analyzedReceiverTypeExpression = objectLookup->typeExpression;
            gcFrame.chainNode->receiverLookupType = gcFrame.analyzedReceiverTypeExpression;
        }

        gcFrame.receiverType = sysbvm_astNode_getAnalyzedType(gcFrame.analyzedReceiver);
        // HACK: remove this literal check when properly implementing this analysis in the target system.
        if(gcFrame.receiverType && sysbvm_astNode_isLiteralNode(context, gcFrame.chainNode->receiver))
        {
            gcFrame.receiverMetaType = sysbvm_tuple_getType(context, gcFrame.receiverType);
            gcFrame.analysisFunction = sysbvm_type_getAnalyzeMessageChainNodeWithEnvironmentFunction(context, gcFrame.receiverMetaType);
            if(gcFrame.analysisFunction)
            {
                SYSBVM_STACKFRAME_POP_SOURCE_POSITION(sourcePositionRecord);
                SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
                return sysbvm_function_apply3(context, gcFrame.analysisFunction, gcFrame.receiverType, (sysbvm_tuple_t)gcFrame.chainNode, *environment);
            }
        }

        // Simple cases.
        if(chainedMessageCount == 0)
        {
            SYSBVM_STACKFRAME_POP_SOURCE_POSITION(sourcePositionRecord);
            SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
            return gcFrame.analyzedReceiver;
        }
        else if(chainedMessageCount == 1)
        {
            gcFrame.chainedMessageNode = sysbvm_array_at(gcFrame.chainNode->messages, 0);
            gcFrame.expansionMessageSequence = sysbvm_astMessageChainMessageNode_expandToMessageWithReceiver(context, gcFrame.chainedMessageNode, gcFrame.analyzedReceiver, gcFrame.analyzedReceiverTypeExpression);
            SYSBVM_STACKFRAME_POP_SOURCE_POSITION(sourcePositionRecord);
            SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
            return sysbvm_interpreter_analyzeASTWithCurrentExpectedTypeWithEnvironment(context, gcFrame.analyzedReceiver, *environment);
        }

        // Do we need to define a variable for the receiver?
        if(sysbvm_astNode_isLiteralNode(context, gcFrame.analyzedReceiver))
        {
            gcFrame.expansionReceiverExpression = gcFrame.analyzedReceiver;
            gcFrame.expansionReceiverIdentifier = gcFrame.analyzedReceiver;
        }
        else
        {
            gcFrame.receiverSourcePosition = sysbvm_astNode_getSourcePosition(gcFrame.analyzedReceiver);
            gcFrame.expansionReceiverSymbol = sysbvm_generatedSymbol_create(context, sysbvm_symbol_internWithCString(context, "<messageChainReceiver>"), gcFrame.receiverSourcePosition);

            gcFrame.expansionReceiverExpression = sysbvm_astVariableDefinitionNode_create(context, gcFrame.receiverSourcePosition, sysbvm_astLiteralNode_create(context, gcFrame.receiverSourcePosition, gcFrame.expansionReceiverSymbol), SYSBVM_NULL_TUPLE, gcFrame.analyzedReceiver, false);
            sysbvm_astVariableDefinitionNode_t *receiverLocalDefinition = (sysbvm_astVariableDefinitionNode_t *)gcFrame.expansionReceiverExpression;
            receiverLocalDefinition->super.analyzedType = gcFrame.receiverType;
            receiverLocalDefinition->super.analyzerToken = sysbvm_analysisAndEvaluationEnvironment_ensureValidAnalyzerToken(context, *environment);
            receiverLocalDefinition->binding = sysbvm_analysisEnvironment_setNewSymbolLocalBinding(context, *environment, gcFrame.receiverSourcePosition, gcFrame.expansionReceiverSymbol, gcFrame.receiverType);

            gcFrame.expansionReceiverIdentifier = sysbvm_astIdentifierReferenceNode_create(context, gcFrame.receiverSourcePosition, gcFrame.expansionReceiverSymbol);
        }
    }

    // Message sequence.
    gcFrame.expandedChainedMessages = sysbvm_array_create(context, chainedMessageCount);
    gcFrame.chainNode->super.analyzedType = SYSBVM_NULL_TUPLE;
    for(size_t i = 0; i < chainedMessageCount; ++i)
    {
        gcFrame.chainedMessageNode = sysbvm_array_at(gcFrame.chainNode->messages, i);
        gcFrame.expandedChainedMessageNode = sysbvm_astMessageChainMessageNode_expandToMessageWithReceiver(context, gcFrame.chainedMessageNode, gcFrame.expansionReceiverIdentifier, gcFrame.analyzedReceiverTypeExpression);
        sysbvm_array_atPut(gcFrame.expandedChainedMessages, i, gcFrame.expandedChainedMessageNode);
    }
    gcFrame.expansionMessageSequence = sysbvm_astSequenceNode_create(context, gcFrame.chainNode->super.sourcePosition, sysbvm_array_create(context, 0), gcFrame.expandedChainedMessages);
    gcFrame.analyzedExpandedChainedMessages = sysbvm_interpreter_analyzeASTWithCurrentExpectedTypeWithEnvironment(context, gcFrame.expansionMessageSequence, *environment);

    // Local definition and message sequence.
    gcFrame.analyzedExpansion = gcFrame.analyzedExpandedChainedMessages;
    if(gcFrame.expansionReceiverExpression != gcFrame.expansionReceiverIdentifier)
    {
        gcFrame.expansionLocalAndMessageSequenceArray = sysbvm_array_create(context, 2);
        sysbvm_array_atPut(gcFrame.expansionLocalAndMessageSequenceArray, 0, gcFrame.expansionReceiverExpression);
        sysbvm_array_atPut(gcFrame.expansionLocalAndMessageSequenceArray, 1, gcFrame.analyzedExpandedChainedMessages);

        gcFrame.analyzedExpansion = sysbvm_astSequenceNode_create(context, gcFrame.chainNode->super.sourcePosition, sysbvm_array_create(context, 0), gcFrame.expansionLocalAndMessageSequenceArray);
        ((sysbvm_astNode_t*)gcFrame.analyzedExpansion)->analyzedType = sysbvm_astNode_getAnalyzedType(gcFrame.analyzedExpandedChainedMessages);
        ((sysbvm_astNode_t*)gcFrame.analyzedExpansion)->analyzerToken = sysbvm_analysisAndEvaluationEnvironment_ensureValidAnalyzerToken(context, *environment);
    }
    
    SYSBVM_STACKFRAME_POP_SOURCE_POSITION(sourcePositionRecord);
    SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
    return gcFrame.analyzedExpansion;
}